

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedStruct.hpp
# Opt level: O2

ParsedStruct * __thiscall ParsedStruct::operator=(ParsedStruct *this,ParsedStruct *oldStruct)

{
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->havingCond);
  std::__cxx11::string::_M_assign((string *)&this->groupAttr);
  std::__cxx11::string::_M_assign((string *)&this->aggFunc);
  std::__cxx11::string::_M_assign((string *)&this->selectCondVect);
  return this;
}

Assistant:

ParsedStruct& operator=(const ParsedStruct& oldStruct)
    {
        this->selectAttr = oldStruct.selectAttr;
        this->havingCond = oldStruct.havingCond;
        this->groupAttr = oldStruct.groupAttr;
        this->aggFunc = oldStruct.aggFunc;
        this->selectCondVect = oldStruct.selectCondVect;
        return *this;
    }